

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O3

Cord __thiscall
google::protobuf::Reflection::GetCord(Reflection *this,Message *message,FieldDescriptor *field)

{
  InternalMetadata *this_00;
  byte bVar1;
  Descriptor *pDVar2;
  void *pvVar3;
  bool bVar4;
  uint32_t uVar5;
  CppStringType CVar6;
  Cord **ppCVar7;
  string *psVar8;
  ArenaStringPtr *pAVar9;
  Cord *data2;
  CordRep *pCVar10;
  FieldDescriptor *in_RCX;
  char *description;
  OneofDescriptor *oneof_descriptor;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 uVar11;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  Metadata MVar12;
  Cord CVar13;
  string_view src;
  
  MVar12 = Message::GetMetadata((Message *)field);
  if (MVar12.reflection != (Reflection *)message) {
LAB_001f1512:
    pDVar2 = (Descriptor *)(message->super_MessageLite)._vptr_MessageLite;
    MVar12 = Message::GetMetadata((Message *)field);
    anon_unknown_6::ReportReflectionUsageMessageError(pDVar2,MVar12.descriptor,in_RCX,"GetCord");
  }
  pDVar2 = (Descriptor *)(message->super_MessageLite)._vptr_MessageLite;
  if (in_RCX->containing_type_ != pDVar2) {
    description = "Field does not match message type.";
LAB_001f1551:
    anon_unknown_6::ReportReflectionUsageError(pDVar2,in_RCX,"GetCord",description);
  }
  bVar1 = in_RCX->field_0x1;
  if (0xbf < bVar1 != (bool)((bVar1 & 0x20) >> 5)) {
    GetCord();
    goto LAB_001f1512;
  }
  if ((bVar1 & 0x20) != 0) {
    description = "Field is repeated; the method requires a singular field.";
    goto LAB_001f1551;
  }
  if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)in_RCX->type_ * 4) != 9) {
    anon_unknown_6::ReportReflectionUsageTypeError(pDVar2,in_RCX,"GetCord",CPPTYPE_STRING);
  }
  this_00 = &(message->super_MessageLite)._internal_metadata_;
  if ((bVar1 & 8) == 0) {
    bVar4 = internal::ReflectionSchema::InRealOneof((ReflectionSchema *)this_00,in_RCX);
    if (bVar4) {
      if ((in_RCX->field_0x1 & 0x10) == 0) {
        oneof_descriptor = (OneofDescriptor *)0x0;
      }
      else {
        oneof_descriptor = (in_RCX->scope_).containing_oneof;
        if (oneof_descriptor == (OneofDescriptor *)0x0) goto LAB_001f1572;
      }
      uVar5 = GetOneofCase((Reflection *)message,(Message *)field,oneof_descriptor);
      if (uVar5 == in_RCX->number_) goto LAB_001f1404;
LAB_001f1480:
      psVar8 = (in_RCX->field_20).default_value_string_;
    }
    else {
LAB_001f1404:
      CVar6 = FieldDescriptor::cpp_string_type(in_RCX);
      if ((CVar6 != kView) && (CVar6 != kString)) {
        if (CVar6 != kCord) {
          GetCord();
LAB_001f1572:
          internal::protobuf_assumption_failed
                    ("res != nullptr",
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                     ,0xb31);
        }
        bVar4 = internal::ReflectionSchema::InRealOneof((ReflectionSchema *)this_00,in_RCX);
        if (bVar4) {
          ppCVar7 = GetRaw<absl::lts_20250127::Cord*>((Reflection *)message,(Message *)field,in_RCX)
          ;
          data2 = *ppCVar7;
          bVar1 = (data2->contents_).data_.rep_.field_0.data[0];
          pCVar10 = (data2->contents_).data_.rep_.field_0.as_tree.rep;
          uVar11 = extraout_RDX;
        }
        else {
          data2 = GetRaw<absl::lts_20250127::Cord>((Reflection *)message,(Message *)field,in_RCX);
          bVar1 = (data2->contents_).data_.rep_.field_0.data[0];
          pCVar10 = (data2->contents_).data_.rep_.field_0.as_tree.rep;
          uVar11 = extraout_RDX_01;
        }
        bVar4 = (bVar1 & 1) == 0;
        uVar11 = CONCAT71((int7)((ulong)uVar11 >> 8),pCVar10 == (CordRep *)0x0 || bVar4);
        if (pCVar10 == (CordRep *)0x0 || bVar4) {
          pCVar10 = (data2->contents_).data_.rep_.field_0.as_tree.rep;
          this->descriptor_ = (Descriptor *)(data2->contents_).data_.rep_.field_0.as_tree.cordz_info
          ;
          (this->schema_).default_instance_ = (Message *)pCVar10;
        }
        else {
          LOCK();
          (pCVar10->refcount).count_.super___atomic_base<int> =
               (__atomic_base<int>)
               ((__int_type_conflict2)(pCVar10->refcount).count_.super___atomic_base<int> + 2);
          UNLOCK();
          (this->schema_).default_instance_ = (Message *)pCVar10;
          this->descriptor_ = (Descriptor *)0x1;
          bVar4 = absl::lts_20250127::cord_internal::InlineData::is_either_profiled
                            ((InlineData *)this,(InlineData *)data2);
          uVar11 = extraout_RDX_02;
          if (bVar4) {
            absl::lts_20250127::cord_internal::CordzInfo::MaybeTrackCordImpl
                      ((InlineData *)this,(InlineData *)data2,kConstructorCord);
            uVar11 = extraout_RDX_03;
          }
        }
        goto LAB_001f1498;
      }
      bVar4 = internal::ReflectionSchema::IsFieldInlined((ReflectionSchema *)this_00,in_RCX);
      if (bVar4) {
        psVar8 = (string *)
                 GetRaw<google::protobuf::internal::InlinedStringField>
                           ((Reflection *)message,(Message *)field,in_RCX);
      }
      else {
        pAVar9 = GetRaw<google::protobuf::internal::ArenaStringPtr>
                           ((Reflection *)message,(Message *)field,in_RCX);
        pvVar3 = (pAVar9->tagged_ptr_).ptr_;
        if (((ulong)pvVar3 & 3) == 0) goto LAB_001f1480;
        psVar8 = (string *)((ulong)pvVar3 & 0xfffffffffffffffc);
      }
    }
  }
  else {
    uVar5 = internal::ReflectionSchema::GetExtensionSetOffset((ReflectionSchema *)this_00);
    psVar8 = internal::ExtensionSet::GetString
                       ((ExtensionSet *)(&field->super_SymbolBase + uVar5),in_RCX->number_,
                        (in_RCX->field_20).default_value_string_);
  }
  src._M_str = (psVar8->_M_dataplus)._M_p;
  src._M_len = psVar8->_M_string_length;
  absl::lts_20250127::Cord::Cord((Cord *)this,src,kConstructorString);
  uVar11 = extraout_RDX_00;
LAB_001f1498:
  CVar13.contents_.data_.rep_.field_0.as_tree.rep = (CordRep *)uVar11;
  CVar13.contents_.data_.rep_.field_0.as_tree.cordz_info = (cordz_info_t)this;
  return (Cord)CVar13.contents_.data_.rep_.field_0;
}

Assistant:

absl::Cord Reflection::GetCord(const Message& message,
                               const FieldDescriptor* field) const {
  USAGE_CHECK_ALL(GetCord, SINGULAR, STRING);
  if (field->is_extension()) {
    return absl::Cord(GetExtensionSet(message).GetString(
        field->number(), internal::DefaultValueStringAsString(field)));
  } else {
    if (schema_.InRealOneof(field) && !HasOneofField(message, field)) {
      return absl::Cord(field->default_value_string());
    }
    switch (field->cpp_string_type()) {
      case FieldDescriptor::CppStringType::kCord:
        if (schema_.InRealOneof(field)) {
          return *GetField<absl::Cord*>(message, field);
        } else {
          return GetField<absl::Cord>(message, field);
        }
      case FieldDescriptor::CppStringType::kView:
      case FieldDescriptor::CppStringType::kString:
        if (IsInlined(field)) {
          return absl::Cord(
              GetField<InlinedStringField>(message, field).GetNoArena());
        } else if (IsMicroString(field)) {
          return absl::Cord(GetField<MicroString>(message, field).Get());
        } else {
          const auto& str = GetField<ArenaStringPtr>(message, field);
          return absl::Cord(str.IsDefault() ? field->default_value_string()
                                            : str.Get());
        }
    }
    internal::Unreachable();
  }
}